

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

int uv_os_get_group(uv_group_t *grp,uv_uid_t gid)

{
  int iVar1;
  char *__buffer;
  size_t sVar2;
  size_t sVar3;
  char **ppcVar4;
  long lVar5;
  long lVar6;
  size_t size;
  char *__dest;
  long lVar7;
  group *result;
  group gp;
  
  if (grp == (uv_group_t *)0x0) {
    iVar1 = -0x16;
  }
  else {
    size = 2000;
    do {
      __buffer = (char *)uv__malloc(size);
      if (__buffer == (char *)0x0) goto LAB_001604b9;
      do {
        iVar1 = getgrgid_r(gid,(group *)&gp,__buffer,size,(group **)&result);
      } while (iVar1 == 4);
      if ((iVar1 == 0) && (result != (group *)0x0)) goto LAB_001603df;
      uv__free(__buffer);
      size = size * 2;
    } while (iVar1 == 0x22);
    if (iVar1 == 0) {
      if (result == (group *)0x0) {
        iVar1 = -2;
      }
      else {
LAB_001603df:
        sVar2 = strlen(gp.gr_name);
        ppcVar4 = gp.gr_mem;
        lVar5 = 8;
        lVar6 = -8;
        for (lVar7 = 0; ppcVar4[lVar7] != (char *)0x0; lVar7 = lVar7 + 1) {
          sVar3 = strlen(ppcVar4[lVar7]);
          lVar5 = lVar5 + sVar3 + 9;
          lVar6 = lVar6 + -8;
        }
        ppcVar4 = (char **)uv__malloc(lVar5 + sVar2 + 1);
        if (ppcVar4 == (char **)0x0) {
          uv__free(__buffer);
LAB_001604b9:
          iVar1 = -0xc;
        }
        else {
          grp->members = ppcVar4;
          ppcVar4[lVar7] = (char *)0x0;
          __dest = (char *)((long)grp->members - lVar6);
          for (lVar6 = 0; lVar7 != lVar6; lVar6 = lVar6 + 1) {
            grp->members[lVar6] = __dest;
            strcpy(__dest,gp.gr_mem[lVar6]);
            sVar3 = strlen(__dest);
            __dest = __dest + sVar3 + 1;
          }
          if (__dest != (char *)((long)grp->members + lVar5)) {
            __assert_fail("gr_mem == (char*)grp->members + mem_size",
                          "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/core.c"
                          ,0x53d,"int uv_os_get_group(uv_group_t *, uv_uid_t)");
          }
          grp->groupname = __dest;
          memcpy(__dest,gp.gr_name,sVar2 + 1);
          grp->gid = (ulong)gp.gr_gid;
          uv__free(__buffer);
          iVar1 = 0;
        }
      }
    }
    else {
      iVar1 = -iVar1;
    }
  }
  return iVar1;
}

Assistant:

int uv_os_get_group(uv_group_t* grp, uv_uid_t gid) {
#if defined(__ANDROID__) && __ANDROID_API__ < 24
  /* This function getgrgid_r() was added in Android N (level 24) */
  return UV_ENOSYS;
#else
  struct group gp;
  struct group* result;
  char* buf;
  char* gr_mem;
  size_t bufsize;
  size_t name_size;
  long members;
  size_t mem_size;
  int r;

  if (grp == NULL)
    return UV_EINVAL;

  /* Calling sysconf(_SC_GETGR_R_SIZE_MAX) would get the suggested size, but it
   * is frequently 1024 or 4096, so we can just use that directly. The pwent
   * will not usually be large. */
  for (bufsize = 2000;; bufsize *= 2) {
    buf = uv__malloc(bufsize);

    if (buf == NULL)
      return UV_ENOMEM;

    do
      r = getgrgid_r(gid, &gp, buf, bufsize, &result);
    while (r == EINTR);

    if (r != 0 || result == NULL)
      uv__free(buf);

    if (r != ERANGE)
      break;
  }

  if (r != 0)
    return UV__ERR(r);

  if (result == NULL)
    return UV_ENOENT;

  /* Allocate memory for the groupname and members. */
  name_size = strlen(gp.gr_name) + 1;
  members = 0;
  mem_size = sizeof(char*);
  for (r = 0; gp.gr_mem[r] != NULL; r++) {
    mem_size += strlen(gp.gr_mem[r]) + 1 + sizeof(char*);
    members++;
  }

  gr_mem = uv__malloc(name_size + mem_size);
  if (gr_mem == NULL) {
    uv__free(buf);
    return UV_ENOMEM;
  }

  /* Copy the members */
  grp->members = (char**) gr_mem;
  grp->members[members] = NULL;
  gr_mem = (char*) &grp->members[members + 1];
  for (r = 0; r < members; r++) {
    grp->members[r] = gr_mem;
    strcpy(gr_mem, gp.gr_mem[r]);
    gr_mem += strlen(gr_mem) + 1;
  }
  assert(gr_mem == (char*)grp->members + mem_size);

  /* Copy the groupname */
  grp->groupname = gr_mem;
  memcpy(grp->groupname, gp.gr_name, name_size);
  gr_mem += name_size;

  /* Copy the gid */
  grp->gid = gp.gr_gid;

  uv__free(buf);

  return 0;
#endif
}